

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O1

void __thiscall Func::RemoveDeadYieldOffsetResumeLabel(Func *this,LabelInstr *label)

{
  Type *pTVar1;
  int iVar2;
  List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  Type pPVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  anon_class_16_2_767aac4c map;
  TElementType local_48;
  LabelInstr *local_30;
  LabelInstr *label_local;
  uint32 offset;
  
  map.label = &local_30;
  map.offset = (uint32 *)((long)&label_local + 4);
  local_30 = label;
  bVar5 = JsUtil::
          List<JsUtil::Pair<unsigned_int,IR::LabelInstr*,DefaultComparer>,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
          ::
          MapUntilFrom<Func::RemoveDeadYieldOffsetResumeLabel(IR::LabelInstr*)::_lambda(int,JsUtil::Pair<unsigned_int,IR::LabelInstr*,DefaultComparer>&)_1_>
                    ((List<JsUtil::Pair<unsigned_int,IR::LabelInstr*,DefaultComparer>,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                      *)this->m_yieldOffsetResumeLabelList,0,map);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.h"
                       ,0x3b5,"(found)","found");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  local_48.first = label_local._4_4_;
  local_48.second = local_30;
  local_48.initialized = true;
  Js::
  CopyRemovePolicy<JsUtil::List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
  ::Remove(&this->m_yieldOffsetResumeLabelList->removePolicy,this->m_yieldOffsetResumeLabelList,
           &local_48);
  this_00 = this->m_yieldOffsetResumeLabelList;
  JsUtil::
  List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::EnsureArray(this_00,0);
  pPVar3 = (this_00->
           super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
           ).buffer;
  iVar2 = (this_00->
          super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
          ).count;
  pPVar3[iVar2].first = label_local._4_4_;
  pPVar3[iVar2].second = (LabelInstr *)0x0;
  pPVar3[iVar2].initialized = true;
  pTVar1 = &(this_00->
            super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
            ).count;
  *pTVar1 = *pTVar1 + 1;
  return;
}

Assistant:

void RemoveDeadYieldOffsetResumeLabel(IR::LabelInstr* label)
    {
        uint32 offset;
        bool found = m_yieldOffsetResumeLabelList->MapUntil([&offset, &label](int i, YieldOffsetResumeLabel& yorl)
        {
            if (yorl.Second() == label)
            {
                offset = yorl.First();
                return true;
            }
            return false;
        });
        Assert(found);
        RemoveYieldOffsetResumeLabel(YieldOffsetResumeLabel(offset, label));
        AddYieldOffsetResumeLabel(offset, nullptr);
    }